

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O1

void __thiscall
booster::callback<int(int&)>::callback<int(*)(int&)>
          (callback<int(int&)> *this,_func_int_int_ptr *func)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x18);
  *puVar1 = &PTR__refcounted_0010ba78;
  booster::atomic_counter::atomic_counter((atomic_counter *)(puVar1 + 1),0);
  *puVar1 = &PTR__refcounted_0010bcb8;
  puVar1[2] = func;
  *(undefined8 **)this = puVar1;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}